

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O0

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
Gudhi::read_persistence_intervals_in_dimension
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,string *filename,int only_this_dim)

{
  string *this;
  function_output_iterator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_common_include_gudhi_reader_utils_h:359:54)>
  fVar1;
  function_output_iterator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_common_include_gudhi_reader_utils_h:359:54)>
  out;
  anon_class_16_2_79cef270_for_m_f local_40;
  uint local_30;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *local_28;
  undefined1 local_1d;
  int local_1c;
  string *psStack_18;
  int only_this_dim_local;
  string *filename_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *ret;
  
  local_1d = 0;
  local_1c = only_this_dim;
  psStack_18 = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (__return_storage_ptr__);
  this = psStack_18;
  local_40.only_this_dim = local_1c;
  local_40.ret = __return_storage_ptr__;
  fVar1 = boost::iterators::
          make_function_output_iterator<Gudhi::read_persistence_intervals_in_dimension(std::__cxx11::string_const&,int)::_lambda(std::tuple<int,double,double>)_1_>
                    (&local_40);
  out.m_f._0_8_ = fVar1.m_f.ret;
  local_30 = fVar1.m_f.only_this_dim;
  out.m_f.ret._0_4_ = local_30;
  out.m_f.ret._4_4_ = 0;
  local_28 = out.m_f._0_8_;
  read_persistence_intervals_and_dimension<boost::iterators::function_output_iterator<Gudhi::read_persistence_intervals_in_dimension(std::__cxx11::string_const&,int)::_lambda(std::tuple<int,double,double>)_1_>>
            ((Gudhi *)this,(string *)(ulong)local_30,out);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::pair<double, double>> read_persistence_intervals_in_dimension(std::string const& filename,
                                                                                      int only_this_dim = -1) {
  std::vector<std::pair<double, double>> ret;
  read_persistence_intervals_and_dimension(
      filename, boost::make_function_output_iterator([only_this_dim, &ret](std::tuple<int, double, double> t) {
        if (only_this_dim == get<0>(t) || only_this_dim == -1) ret.emplace_back(get<1>(t), get<2>(t));
      }));
  return ret;
}